

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall
amrex::ParmParse::addarr(ParmParse *this,char *name,vector<double,_std::allocator<double>_> *ptr)

{
  double *pdVar1;
  double *pdVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arr;
  stringstream val;
  allocator local_231;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  string local_218;
  string local_1f8;
  value_type local_1d8;
  PP_entry local_1b8 [5];
  
  std::__cxx11::string::string((string *)&local_1f8,name,&local_231);
  prefixedName(&local_218,this,&local_1f8);
  local_230._M_impl._M_node._M_size = 0;
  pdVar1 = (ptr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_230._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_230;
  local_230._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_230;
  for (pdVar2 = (ptr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    *(undefined8 *)
     ((long)&local_1b8[0].m_name.field_2 +
     *(long *)(local_1b8[0].m_name.field_2._M_allocated_capacity - 0x18) + 8) = 0x11;
    std::ostream::_M_insert<double>(*pdVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_230,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  PP_entry::PP_entry(local_1b8,&local_218,
                     (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_230);
  local_1b8[0].m_queried = true;
  std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
  push_back((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
            &(anonymous_namespace)::g_table_abi_cxx11_,local_1b8);
  PP_entry::~PP_entry(local_1b8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_230);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

void
ParmParse::addarr (const char* name,
                const std::vector<double>&  ptr)
{
    saddarr(prefixedName(name),ptr);
}